

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

nn_queue_item * nn_queue_pop(nn_queue *self)

{
  nn_queue_item *result;
  nn_queue *self_local;
  nn_queue_item *local_8;
  
  if (self->head == (nn_queue_item *)0x0) {
    local_8 = (nn_queue_item *)0x0;
  }
  else {
    local_8 = self->head;
    self->head = local_8->next;
    if (self->head == (nn_queue_item *)0x0) {
      self->tail = (nn_queue_item *)0x0;
    }
    local_8->next = (nn_queue_item *)0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

struct nn_queue_item *nn_queue_pop (struct nn_queue *self)
{
    struct nn_queue_item *result;

    if (!self->head)
        return NULL;
    result = self->head;
    self->head = result->next;
    if (!self->head)
        self->tail = NULL;
    result->next = NN_QUEUE_NOTINQUEUE;
    return result;
}